

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall google::protobuf::ValidateQualifiedName(protobuf *this,string_view name)

{
  protobuf pVar1;
  bool bVar2;
  bool bVar3;
  protobuf *ppVar4;
  bool bVar5;
  
  ppVar4 = (protobuf *)0x0;
  bVar2 = false;
  do {
    if (this == ppVar4) {
      return (bool)((bVar2 ^ 1U) & this != (protobuf *)0x0);
    }
    pVar1 = ppVar4[name._M_len];
    if (((byte)(((byte)pVar1 & 0xdf) + 0xbf) < 0x1a) ||
       (pVar1 == (protobuf)0x5f || (byte)((char)pVar1 - 0x30U) < 10)) {
      bVar2 = false;
    }
    else {
      bVar3 = bVar2;
      if (!bVar2) {
        bVar3 = true;
      }
      if (pVar1 != (protobuf)0x2e) {
        return false;
      }
      bVar5 = bVar2 != false;
      bVar2 = bVar3;
      if (bVar5) {
        return false;
      }
    }
    ppVar4 = ppVar4 + 1;
  } while( true );
}

Assistant:

static bool ValidateQualifiedName(absl::string_view name) {
  bool last_was_period = false;

  for (char character : name) {
    // I don't trust isalnum() due to locales.  :(
    if (('a' <= character && character <= 'z') ||
        ('A' <= character && character <= 'Z') ||
        ('0' <= character && character <= '9') || (character == '_')) {
      last_was_period = false;
    } else if (character == '.') {
      if (last_was_period) return false;
      last_was_period = true;
    } else {
      return false;
    }
  }

  return !name.empty() && !last_was_period;
}